

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O0

void __thiscall
FIX::MessageStoreExceptionWrapper::get
          (MessageStoreExceptionWrapper *this,int begin,int end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *msgs,bool *threw,IOException *ex)

{
  IOException *e;
  IOException *ex_local;
  bool *threw_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *msgs_local;
  int end_local;
  int begin_local;
  MessageStoreExceptionWrapper *this_local;
  
  *threw = false;
  (**(code **)(**(long **)this + 0x18))(*(long **)this,begin,end,msgs);
  return;
}

Assistant:

void MessageStoreExceptionWrapper::get( int begin, int end, std::vector < std::string > & msgs, bool& threw, IOException& ex ) const
{
  threw = false;
  try { m_pStore->get( begin, end, msgs ); }
  catch ( IOException & e ) { threw = true; ex = e; }
}